

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

Arena * tcmalloc::LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  Arena *this;
  long extraout_RDX;
  bool bVar2;
  
  if (allocator == (PagesAllocator *)0x0) {
    this = (Arena *)AllocWithArena(0x140,(Arena *)0x0);
    Arena::Arena(this);
  }
  else {
    iVar1 = (*allocator->_vptr_PagesAllocator[2])(allocator,0x100000);
    this = (Arena *)CONCAT44(extraout_var,iVar1);
    Arena::Arena(this);
    this->allocator = allocator;
    LOCK();
    bVar2 = (this->mu).lockword_.super___atomic_base<int>._M_i == 0;
    if (bVar2) {
      (this->mu).lockword_.super___atomic_base<int>._M_i = 1;
    }
    UNLOCK();
    if (!bVar2) {
      SpinLock::SlowLock((SpinLock *)this);
    }
    *(long *)(this + 1) = extraout_RDX + -0x140;
    this[1].freelist.header.size = (ulong)(this + 1) ^ 0x4c833e95;
    this[1].freelist.header.magic = (intptr_t)this;
    AddToFreelist(&this[1].freelist.header.dummy_for_alignment,this);
    LOCK();
    iVar1 = (this->mu).lockword_.super___atomic_base<int>._M_i;
    (this->mu).lockword_.super___atomic_base<int>._M_i = 0;
    UNLOCK();
    if (iVar1 != 1) {
      SpinLock::SlowUnlock((SpinLock *)this);
    }
  }
  return this;
}

Assistant:

LowLevelAlloc::Arena *LowLevelAlloc::NewArenaWithCustomAlloc(PagesAllocator *allocator) {
  if (allocator) {
    void* memory;
    size_t got_amount;
    std::tie(memory, got_amount) = allocator->MapPages(kMinimalRegion);

    Arena *result = new (memory) Arena();
    result->allocator = allocator;
    result->mu.Lock();
    result->InsertAllocatedMemoryLocked(result + 1, got_amount - sizeof(Arena));
    result->mu.Unlock();
    return result;
  }

  return new (AllocWithArena(sizeof(Arena), nullptr)) Arena();
}